

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_UnwrapKey
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hUnwrappingKey,CK_BYTE_PTR pWrappedKey,CK_ULONG ulWrappedKeyLen,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_HANDLE_PTR hKey)

{
  CK_MECHANISM_TYPE CVar1;
  void *pvVar2;
  _Base_ptr p_Var3;
  char cVar4;
  undefined4 in_EAX;
  int iVar5;
  int iVar6;
  SoftHSM *pSVar7;
  CK_STATE CVar8;
  CK_RV CVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  *pmVar11;
  _Rb_tree_header *p_Var12;
  CK_ATTRIBUTE *pCVar13;
  size_t sVar14;
  uchar *__s2;
  size_t sVar15;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long *plVar16;
  OSObject *key;
  OSAttribute *this_00;
  CK_ATTRIBUTE *pCVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  Session *local_4c0;
  Token *local_4b8;
  SoftHSM *local_4b0;
  _Base_ptr local_4a8;
  _func_int **local_4a0;
  CK_OBJECT_CLASS objClass;
  ByteString wrapped;
  CK_KEY_TYPE keyType;
  ByteString keydata;
  CK_ULONG local_418;
  ByteString value_1;
  OSAttribute unwrapAttr;
  CK_CERTIFICATE_TYPE dummy;
  CK_ATTRIBUTE secretAttribs [32];
  
  if (this->isInitialised != true) {
    return 400;
  }
  auVar19._0_4_ = -(uint)(pMechanism == (CK_MECHANISM_PTR)0x0);
  auVar19._4_4_ = -(uint)(pWrappedKey == (CK_BYTE_PTR)0x0);
  auVar19._8_4_ = -(uint)(pTemplate == (CK_ATTRIBUTE_PTR)0x0);
  auVar19._12_4_ = -(uint)(hKey == (CK_OBJECT_HANDLE_PTR)0x0);
  iVar5 = movmskps(in_EAX,auVar19);
  if (iVar5 != 0) {
    return 7;
  }
  pSVar7 = (SoftHSM *)this->handleManager;
  local_4c0 = (Session *)HandleManager::getSession((HandleManager *)pSVar7,hSession);
  if (local_4c0 == (Session *)0x0) {
    return 0xb3;
  }
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x1085) {
    if (CVar1 != 1) {
      if (CVar1 != 9) {
        if (CVar1 != 0x136) {
          return 0x70;
        }
        if (pMechanism->pParameter == (void *)0x0) {
          return 7;
        }
        bVar18 = pMechanism->ulParameterLen == 8;
        goto LAB_001426bb;
      }
      CVar9 = MechParamCheckRSAPKCSOAEP(pSVar7,pMechanism);
      if (CVar9 != 0) {
        return CVar9;
      }
    }
  }
  else {
    if (CVar1 == 0x1085) {
      if (pMechanism->pParameter == (void *)0x0) {
        return 7;
      }
      bVar18 = pMechanism->ulParameterLen == 0x10;
    }
    else {
      if (CVar1 == 0x210a) {
        bVar18 = ulWrappedKeyLen < 0x10;
      }
      else {
        if (CVar1 != 0x2109) {
          return 0x70;
        }
        bVar18 = ulWrappedKeyLen < 0x18;
      }
      if ((bool)((ulWrappedKeyLen & 7) != 0 | bVar18)) {
        return 0x112;
      }
      if (pMechanism->pParameter != (void *)0x0) {
        return 7;
      }
      bVar18 = pMechanism->ulParameterLen == 0;
    }
LAB_001426bb:
    if (!bVar18) {
      return 7;
    }
  }
  local_4b8 = Session::getToken(local_4c0);
  if (local_4b8 == (Token *)0x0) {
    return 5;
  }
  pSVar7 = (SoftHSM *)HandleManager::getObject(this->handleManager,hUnwrappingKey);
  if (pSVar7 == (SoftHSM *)0x0) {
    return 0xf0;
  }
  iVar5 = (*pSVar7->_vptr_SoftHSM[10])(pSVar7);
  if ((char)iVar5 == '\0') {
    return 0xf0;
  }
  iVar5 = (*pSVar7->_vptr_SoftHSM[4])(pSVar7,1,0);
  iVar6 = (*pSVar7->_vptr_SoftHSM[4])(pSVar7,2,1);
  local_4b0 = pSVar7;
  CVar8 = Session::getState(local_4c0);
  CVar9 = haveRead(CVar8,(CK_BBOOL)iVar5,(CK_BBOOL)iVar6);
  pSVar7 = local_4b0;
  if (CVar9 != 0) {
    if (CVar9 != 0x101) {
      return CVar9;
    }
    iVar5 = 0x1b53;
LAB_0014278e:
    softHSMLog(6,"C_UnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar5,"User is not authorized");
    return 0x101;
  }
  uVar10 = pMechanism->mechanism;
  if (uVar10 - 0x2109 < 2) {
    iVar5 = (*local_4b0->_vptr_SoftHSM[5])(local_4b0,0,0x80000000);
    if (CONCAT44(extraout_var,iVar5) != 4) {
      return 0xf2;
    }
    uVar10 = pMechanism->mechanism;
    if (uVar10 == 0x2109) {
      iVar5 = (*pSVar7->_vptr_SoftHSM[5])(pSVar7,0x100,0x80000000);
      if (CONCAT44(extraout_var_00,iVar5) != 0x1f) {
        return 0xf2;
      }
      uVar10 = pMechanism->mechanism;
    }
    if (uVar10 == 0x210a) {
      iVar5 = (*pSVar7->_vptr_SoftHSM[5])(pSVar7,0x100,0x80000000);
      if (CONCAT44(extraout_var_01,iVar5) != 0x1f) {
        return 0xf2;
      }
      uVar10 = pMechanism->mechanism;
    }
  }
  if ((uVar10 | 8) == 9) {
    iVar5 = (*pSVar7->_vptr_SoftHSM[5])(pSVar7,0,0x80000000);
    if (CONCAT44(extraout_var_02,iVar5) != 3) {
      return 0xf2;
    }
    uVar10 = pMechanism->mechanism;
  }
  if ((uVar10 | 8) == 9) {
    iVar5 = (*pSVar7->_vptr_SoftHSM[5])(pSVar7,0x100,0x80000000);
    if (CONCAT44(extraout_var_03,iVar5) != 0) {
      return 0xf2;
    }
    uVar10 = pMechanism->mechanism;
  }
  if ((uVar10 == 0x1085) || (uVar10 == 0x1082)) {
    iVar5 = (*pSVar7->_vptr_SoftHSM[5])(pSVar7,0x100,0x80000000);
    if (CONCAT44(extraout_var_04,iVar5) != 0x1f) {
      return 0x115;
    }
    uVar10 = pMechanism->mechanism;
  }
  if (uVar10 == 0x133) {
    iVar5 = (*pSVar7->_vptr_SoftHSM[5])(pSVar7,0x100,0x80000000);
    if (CONCAT44(extraout_var_05,iVar5) != 0x14) {
      return 0x115;
    }
    iVar5 = (*pSVar7->_vptr_SoftHSM[5])(pSVar7,0x100,0x80000000);
    if (CONCAT44(extraout_var_06,iVar5) != 0x15) {
      return 0x115;
    }
  }
  iVar5 = (*pSVar7->_vptr_SoftHSM[4])(pSVar7,0x107,0);
  if ((char)iVar5 == '\0') {
    return 0x68;
  }
  bVar18 = isMechanismPermitted(this,(OSObject *)pSVar7,pMechanism);
  if (!bVar18) {
    return 0x70;
  }
  isOnToken = '\0';
  isPrivate = '\x01';
  CVar9 = extractObjectInformation
                    (pTemplate,ulCount,&objClass,&keyType,&dummy,&isOnToken,&isPrivate,false);
  if (CVar9 != 0) {
    softHSMLog(3,"C_UnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1b7b,"Mandatory attribute not present in template");
    return CVar9;
  }
  if (objClass - 5 < 0xfffffffffffffffe) {
    return 0x13;
  }
  CVar8 = Session::getState(local_4c0);
  CVar9 = haveWrite(CVar8,isOnToken,isPrivate);
  if (CVar9 != 0) {
    if (CVar9 == 0xb5) {
      softHSMLog(6,"C_UnwrapKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1b8b,"Session is read-only");
      return 0xb5;
    }
    if (CVar9 != 0x101) {
      return CVar9;
    }
    iVar5 = 0x1b89;
    goto LAB_0014278e;
  }
  memset(secretAttribs,0,0x300);
  secretAttribs[0].pValue = &objClass;
  secretAttribs[0].ulValueLen = 8;
  secretAttribs[1].type = 1;
  secretAttribs[1].pValue = &isOnToken;
  secretAttribs[1].ulValueLen = 1;
  secretAttribs[2].type = 2;
  secretAttribs[2].pValue = &isPrivate;
  secretAttribs[2].ulValueLen = 1;
  secretAttribs[3].type = 0x100;
  secretAttribs[3].pValue = &keyType;
  secretAttribs[3].ulValueLen = 8;
  if (0x1c < ulCount) {
    return 0xd1;
  }
  if (ulCount == 0) {
    local_4c0 = (Session *)0x4;
  }
  else {
    local_4c0 = (Session *)0x4;
    do {
      if ((2 < pTemplate->type) && (pTemplate->type != 0x100)) {
        secretAttribs[(long)local_4c0].ulValueLen = pTemplate->ulValueLen;
        pvVar2 = pTemplate->pValue;
        secretAttribs[(long)local_4c0].type = pTemplate->type;
        secretAttribs[(long)local_4c0].pValue = pvVar2;
        local_4c0 = (Session *)((long)local_4c0 + 1);
      }
      pTemplate = pTemplate + 1;
      ulCount = ulCount - 1;
    } while (ulCount != 0);
  }
  iVar5 = (*local_4b0->_vptr_SoftHSM[2])(local_4b0,0x40000212);
  if ((char)iVar5 != '\0') {
    (*local_4b0->_vptr_SoftHSM[3])(&unwrapAttr,local_4b0,0x40000212);
    bVar18 = OSAttribute::isAttributeMapAttribute(&unwrapAttr);
    if (bVar18) {
      pmVar11 = OSAttribute::getAttributeMapValue(&unwrapAttr);
      local_4a8 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 = &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_4a8 != p_Var12) {
        local_4a0 = (_func_int **)&PTR__ByteString_0019d880;
        do {
          if (local_4c0 == (Session *)0x0) {
LAB_00142f4a:
            OSAttribute::~OSAttribute(&unwrapAttr);
            return 0xd1;
          }
          p_Var3 = local_4a8 + 1;
          pCVar17 = secretAttribs;
          local_418 = (CK_ULONG)local_4c0;
          pCVar13 = (CK_ATTRIBUTE *)0x0;
          do {
            if (*(CK_ATTRIBUTE_TYPE *)(local_4a8 + 1) == pCVar17->type) {
              if (pCVar13 != (CK_ATTRIBUTE *)0x0) goto LAB_00142f4a;
              ByteString::ByteString(&wrapped);
              OSAttribute::peekValue((OSAttribute *)&p_Var3->_M_parent,&wrapped);
              sVar15 = pCVar17->ulValueLen;
              sVar14 = ByteString::size(&wrapped);
              if (sVar15 != sVar14) {
                wrapped._vptr_ByteString = local_4a0;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&wrapped.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                goto LAB_00142f4a;
              }
              pvVar2 = pCVar17->pValue;
              __s2 = ByteString::const_byte_str(&wrapped);
              sVar15 = ByteString::size(&wrapped);
              iVar5 = bcmp(pvVar2,__s2,sVar15);
              wrapped._vptr_ByteString = local_4a0;
              std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                        (&wrapped.byteString.
                          super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
              pCVar13 = pCVar17;
              if (iVar5 != 0) goto LAB_00142f4a;
            }
            pCVar17 = pCVar17 + 1;
            local_418 = local_418 - 1;
          } while (local_418 != 0);
          if (pCVar13 == (CK_ATTRIBUTE *)0x0) goto LAB_00142f4a;
          local_4a8 = (_Base_ptr)std::_Rb_tree_increment(local_4a8);
        } while ((_Rb_tree_header *)local_4a8 != p_Var12);
      }
    }
    OSAttribute::~OSAttribute(&unwrapAttr);
  }
  *hKey = 0;
  ByteString::ByteString(&wrapped,pWrappedKey,ulWrappedKeyLen);
  ByteString::ByteString(&keydata);
  pSVar7 = local_4b0;
  iVar5 = (*local_4b0->_vptr_SoftHSM[5])(local_4b0,0,0x80000000);
  if (CONCAT44(extraout_var_07,iVar5) == 4) {
    CVar9 = UnwrapKeySym(pSVar7,pMechanism,&wrapped,local_4b8,(OSObject *)local_4b0,&keydata);
  }
  else {
    pSVar7 = local_4b0;
    iVar5 = (*local_4b0->_vptr_SoftHSM[5])(local_4b0,0,0x80000000);
    CVar9 = 0xf2;
    if (CONCAT44(extraout_var_08,iVar5) != 3) goto LAB_00142e11;
    CVar9 = UnwrapKeyAsym(pSVar7,pMechanism,&wrapped,local_4b8,(OSObject *)local_4b0,&keydata);
  }
  if (CVar9 != 0) goto LAB_00142e11;
  CVar9 = CreateObject(this,hSession,secretAttribs,(CK_ULONG)local_4c0,hKey,6);
  if (CVar9 == 0) {
    key = (OSObject *)HandleManager::getObject(this->handleManager,*hKey);
    CVar9 = 6;
    if (((key != (OSObject *)0x0) && (iVar5 = (*key->_vptr_OSObject[10])(key), (char)iVar5 != '\0'))
       && (iVar5 = (*key->_vptr_OSObject[0xb])(key), (char)iVar5 != '\0')) {
      OSAttribute::OSAttribute(&unwrapAttr,false);
      iVar5 = (*key->_vptr_OSObject[8])(key,0x163,&unwrapAttr);
      this_00 = &unwrapAttr;
      OSAttribute::~OSAttribute(this_00);
      if ((char)iVar5 == '\0') {
LAB_00142f5c:
        cVar4 = '\0';
      }
      else {
        OSAttribute::OSAttribute(&unwrapAttr,false);
        iVar5 = (*key->_vptr_OSObject[8])(key,0x165,&unwrapAttr);
        this_00 = &unwrapAttr;
        OSAttribute::~OSAttribute(this_00);
        if ((char)iVar5 == '\0') goto LAB_00142f5c;
        OSAttribute::OSAttribute(&unwrapAttr,false);
        iVar5 = (*key->_vptr_OSObject[8])(key,0x164,&unwrapAttr);
        cVar4 = (char)iVar5;
        this_00 = &unwrapAttr;
        OSAttribute::~OSAttribute(this_00);
      }
      if (objClass == 4) {
        ByteString::ByteString(&value_1);
        if (isPrivate == '\0') {
          ByteString::operator=(&value_1,&keydata);
        }
        else {
          Token::encrypt(local_4b8,(char *)&keydata,(int)&value_1);
        }
        if (cVar4 != '\0') {
          OSAttribute::OSAttribute(&unwrapAttr,&value_1);
          iVar5 = (*key->_vptr_OSObject[8])(key,0x11,&unwrapAttr);
          OSAttribute::~OSAttribute(&unwrapAttr);
          value_1._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&value_1.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          cVar4 = (char)iVar5;
          goto joined_r0x00143120;
        }
        value_1._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&value_1.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
      else {
        switch(keyType) {
        case 0:
          if (cVar4 != '\0') {
            cVar4 = setRSAPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
joined_r0x00143120:
            if (cVar4 != '\0') {
              iVar5 = (*key->_vptr_OSObject[0xc])(key);
              if ((char)iVar5 != '\0') {
                CVar9 = 0;
                goto LAB_00142e11;
              }
              goto LAB_00142dc4;
            }
          }
          break;
        case 1:
          if (cVar4 != '\0') {
            cVar4 = setDSAPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x00143120;
          }
          break;
        case 2:
          if (cVar4 != '\0') {
            cVar4 = setDHPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x00143120;
          }
          break;
        case 3:
          if (cVar4 != '\0') {
            cVar4 = setECPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x00143120;
          }
          break;
        default:
          if ((keyType == 0x40) && (cVar4 != '\0')) {
            cVar4 = setEDPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x00143120;
          }
        }
      }
      (*key->_vptr_OSObject[0xd])(key);
    }
  }
LAB_00142dc4:
  if (*hKey != 0) {
    plVar16 = (long *)HandleManager::getObject(this->handleManager,*hKey);
    HandleManager::destroyObject(this->handleManager,*hKey);
    if (plVar16 != (long *)0x0) {
      (**(code **)(*plVar16 + 0x70))(plVar16);
    }
    *hKey = 0;
  }
LAB_00142e11:
  keydata._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&keydata.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>)
  ;
  wrapped._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&wrapped.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>)
  ;
  return CVar9;
}

Assistant:

CK_RV SoftHSM::C_UnwrapKey
(
	CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hUnwrappingKey,
	CK_BYTE_PTR pWrappedKey,
	CK_ULONG ulWrappedKeyLen,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR hKey
)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pWrappedKey == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (hKey == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	CK_RV rv;
	// Check the mechanism
	switch(pMechanism->mechanism)
	{
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			if ((ulWrappedKeyLen < 24) || ((ulWrappedKeyLen % 8) != 0))
				return CKR_WRAPPED_KEY_LEN_RANGE;
			// Does not handle optional init vector
			if (pMechanism->pParameter != NULL_PTR ||
                            pMechanism->ulParameterLen != 0)
				return CKR_ARGUMENTS_BAD;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			if ((ulWrappedKeyLen < 16) || ((ulWrappedKeyLen % 8) != 0))
				return CKR_WRAPPED_KEY_LEN_RANGE;
			// Does not handle optional init vector
			if (pMechanism->pParameter != NULL_PTR ||
                            pMechanism->ulParameterLen != 0)
				return CKR_ARGUMENTS_BAD;
			break;
#endif
		case CKM_RSA_PKCS:
			// Input length checks needs to be done later when unwrapping key is known
			break;
		case CKM_RSA_PKCS_OAEP:
			rv = MechParamCheckRSAPKCSOAEP(pMechanism);
			if (rv != CKR_OK)
				return rv;
			break;

	        case CKM_AES_CBC_PAD:
			// TODO check block length
			if (pMechanism->pParameter == NULL_PTR ||
                            pMechanism->ulParameterLen != 16)
				return CKR_ARGUMENTS_BAD;
			break;

	        case CKM_DES3_CBC_PAD:
			// TODO check block length
			if (pMechanism->pParameter == NULL_PTR ||
                            pMechanism->ulParameterLen != 8)
				return CKR_ARGUMENTS_BAD;
			break;
			
		default:
			return CKR_MECHANISM_INVALID;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the unwrapping key handle.
	OSObject *unwrapKey = (OSObject *)handleManager->getObject(hUnwrappingKey);
	if (unwrapKey == NULL_PTR || !unwrapKey->isValid()) return CKR_UNWRAPPING_KEY_HANDLE_INVALID;

	CK_BBOOL isUnwrapKeyOnToken = unwrapKey->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isUnwrapKeyPrivate = unwrapKey->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	rv = haveRead(session->getState(), isUnwrapKeyOnToken, isUnwrapKeyPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check unwrapping key class and type
	if ((pMechanism->mechanism == CKM_AES_KEY_WRAP || pMechanism->mechanism == CKM_AES_KEY_WRAP_PAD) && unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_SECRET_KEY)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_AES_KEY_WRAP && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_AES_KEY_WRAP_PAD && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_RSA_PKCS || pMechanism->mechanism == CKM_RSA_PKCS_OAEP) && unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_PRIVATE_KEY)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_RSA_PKCS || pMechanism->mechanism == CKM_RSA_PKCS_OAEP) && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_RSA)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_AES_CBC || pMechanism->mechanism == CKM_AES_CBC_PAD) && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_WRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DES3_CBC && (unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DES2 ||
		unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DES3))
		return CKR_WRAPPING_KEY_TYPE_INCONSISTENT;
	
	// Check if the unwrapping key can be used for unwrapping
	if (unwrapKey->getBooleanValue(CKA_UNWRAP, false) == false)
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the unwrap key
	if (!isMechanismPermitted(unwrapKey, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass;
	CK_KEY_TYPE keyType;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	CK_CERTIFICATE_TYPE dummy;
	bool isImplicit = false;
	rv = extractObjectInformation(pTemplate, ulCount, objClass, keyType, dummy, isOnToken, isPrivate, isImplicit);
	if (rv != CKR_OK)
	{
		ERROR_MSG("Mandatory attribute not present in template");
		return rv;
	}

	// Report errors and/or unexpected usage.
	if (objClass != CKO_SECRET_KEY && objClass != CKO_PRIVATE_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	// Key type will be handled at object creation

	// Check authorization
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Build unwrapped key template
	const CK_ULONG maxAttribs = 32;
	CK_ATTRIBUTE secretAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) }
	};
	CK_ULONG secretAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - secretAttribsCount))
		return CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i = 0; i < ulCount; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
				continue;
			default:
				secretAttribs[secretAttribsCount++] = pTemplate[i];
		}
	}

	// Apply the unwrap template
	if (unwrapKey->attributeExists(CKA_UNWRAP_TEMPLATE))
	{
		OSAttribute unwrapAttr = unwrapKey->getAttribute(CKA_UNWRAP_TEMPLATE);

		if (unwrapAttr.isAttributeMapAttribute())
		{
			typedef std::map<CK_ATTRIBUTE_TYPE,OSAttribute> attrmap_type;

			const attrmap_type& map = unwrapAttr.getAttributeMapValue();

			for (attrmap_type::const_iterator it = map.begin(); it != map.end(); ++it)
			{
				CK_ATTRIBUTE* attr = NULL;
				for (CK_ULONG i = 0; i < secretAttribsCount; ++i)
				{
					if (it->first == secretAttribs[i].type)
					{
						if (attr != NULL)
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
						attr = &secretAttribs[i];
						ByteString value;
						it->second.peekValue(value);
						if (attr->ulValueLen != value.size())
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
						if (memcmp(attr->pValue, value.const_byte_str(), value.size()) != 0)
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
					}
				}
				if (attr == NULL)
				{
					return CKR_TEMPLATE_INCONSISTENT;
				}
			}
		}
	}

	*hKey = CK_INVALID_HANDLE;

	// Unwrap the key
	ByteString wrapped(pWrappedKey, ulWrappedKeyLen);
	ByteString keydata;
	if (unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) == CKO_SECRET_KEY)
		rv = UnwrapKeySym(pMechanism, wrapped, token, unwrapKey, keydata);
	else if (unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) == CKO_PRIVATE_KEY)
		rv = UnwrapKeyAsym(pMechanism, wrapped, token, unwrapKey, keydata);
	else
		rv = CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (rv != CKR_OK)
		return rv;

	// Create the secret object using C_CreateObject
	rv = this->CreateObject(hSession, secretAttribs, secretAttribsCount, hKey, OBJECT_OP_UNWRAP);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*hKey);
		if (osobject == NULL_PTR || !osobject->isValid())
        {
			rv = CKR_FUNCTION_FAILED;
        }
		else if (osobject->startTransaction())
		{
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL, false);

			// Common Secret Key Attributes
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, false);

			// Secret Attributes
			if (objClass == CKO_SECRET_KEY)
			{
				ByteString value;
				if (isPrivate)
					token->encrypt(keydata, value);
				else
					value = keydata;
				bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			}
			else if (keyType == CKK_RSA)
			{
				bOK = bOK && setRSAPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
			else if (keyType == CKK_DSA)
			{
				bOK = bOK && setDSAPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
			else if (keyType == CKK_DH)
			{
				bOK = bOK && setDHPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#ifdef WITH_ECC
			else if (keyType == CKK_EC)
			{
				bOK = bOK && setECPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
#ifdef WITH_EDDSA
			else if (keyType == CKK_EC_EDWARDS)
			{
				bOK = bOK && setEDPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
#ifdef WITH_GOST
			else if (keyType == CKK_GOSTR3410)
			{
				bOK = bOK && setGOSTPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
			else
				bOK = false;

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		}
		else
			rv = CKR_FUNCTION_FAILED;
	}

	// Remove secret that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*hKey != CK_INVALID_HANDLE)
		{
			OSObject* obj = (OSObject*)handleManager->getObject(*hKey);
			handleManager->destroyObject(*hKey);
			if (obj) obj->destroyObject();
			*hKey = CK_INVALID_HANDLE;
		}

	}

	return rv;
}